

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *this;
  float fVar5;
  int local_164;
  int *local_160;
  int *value4;
  short *local_150;
  short *value3;
  short *local_140;
  short *value2;
  int *local_130;
  int *value1;
  Stack<8UL> fa;
  float unsafeDuration;
  float threadSafeDuration;
  float classicDuration;
  undefined1 local_70 [8];
  vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_> tssv;
  vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_> sv;
  
  std::vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::vector
            ((vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_> *)
             &tssv.
              super__Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>::vector
            ((vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_> *)
             local_70);
  fVar5 = testClassic();
  fa._156_4_ = testThreadSafeAllocator();
  fa._152_4_ = testUnsafeAllocator();
  bVar1 = false;
  if (((float)fa._152_4_ < (float)fa._156_4_) && (bVar1 = false, (float)fa._156_4_ < fVar5)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && \"Allocator is too slow\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x49,"int main()");
  }
  AO::Allocator::Version_1::Stack<8UL>::Stack((Stack<8UL> *)&value1);
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 0) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("fa.empty() && fa.size() == 0 && \"Allocator should be empty\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x4b,"int main()");
  }
  value2._4_4_ = 1;
  local_130 = AO::Allocator::Version_1::Stack<8ul>::create<int,int>
                        ((Stack<8ul> *)&value1,(int *)((long)&value2 + 4));
  if (*local_130 != 1) {
    __assert_fail("*value1 == 1 && \"Object not constructed properly\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x4d,"int main()");
  }
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == sizeof(int) && \"Allocator should contain 1 element\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x4e,"int main()");
  }
  value3._4_4_ = 2;
  local_140 = AO::Allocator::Version_1::Stack<8ul>::create<short,int>
                        ((Stack<8ul> *)&value1,(int *)((long)&value3 + 4));
  if (*local_140 != 2) {
    __assert_fail("*value2 == 2 && \"Object not constructed properly\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x50,"int main()");
  }
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 6) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && \"Allocator should contain 2 elements\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x51,"int main()");
  }
  value4._4_4_ = 3;
  local_150 = AO::Allocator::Version_1::Stack<8ul>::create<short,int>
                        ((Stack<8ul> *)&value1,(int *)((long)&value4 + 4));
  if (*local_150 != 3) {
    __assert_fail("*value3 == 3 && \"Object not constructed properly\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x53,"int main()");
  }
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    sVar4 = AO::Allocator::Version_1::Stack<8UL>::capacity((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == sVar4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == fa.capacity() && \"Allocator should be full\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x54,"int main()");
  }
  local_164 = 4;
  local_160 = AO::Allocator::Version_1::Stack<8ul>::create<int,int>
                        ((Stack<8ul> *)&value1,&local_164);
  if (*local_160 != 4) {
    __assert_fail("*value4 == 4 && \"Object not constructed properly\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x56,"int main()");
  }
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    sVar4 = AO::Allocator::Version_1::Stack<8UL>::capacity((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == sVar4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == fa.capacity() && \"Allocator should be full\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x57,"int main()");
  }
  AO::Allocator::Version_1::Stack<8UL>::destroy<int>((Stack<8UL> *)&value1,local_160);
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    sVar4 = AO::Allocator::Version_1::Stack<8UL>::capacity((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == sVar4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == fa.capacity() && \"Allocator should still be full (because the last element was out of stack bounds)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x59,"int main()");
  }
  AO::Allocator::Version_1::Stack<8UL>::destroy<short>((Stack<8UL> *)&value1,local_150);
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 6) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && \"Allocator should contain 2 elements\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x5c,"int main()");
  }
  AO::Allocator::Version_1::Stack<8UL>::destroy<short>((Stack<8UL> *)&value1,local_140);
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (!bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!fa.empty() && fa.size() == sizeof(int) && \"Allocator should contain 1 element\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x5f,"int main()");
  }
  AO::Allocator::Version_1::Stack<8UL>::destroy<int>((Stack<8UL> *)&value1,local_130);
  bVar2 = AO::Allocator::Version_1::Stack<8UL>::empty((Stack<8UL> *)&value1);
  bVar1 = false;
  if (bVar2) {
    sVar3 = AO::Allocator::Version_1::Stack<8UL>::size((Stack<8UL> *)&value1);
    bVar1 = false;
    if (sVar3 == 0) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("fa.empty() && fa.size() == 0 && \"Allocator should be empty\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x62,"int main()");
  }
  this = std::operator<<((ostream *)&std::cout,"Success!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  AO::Allocator::Version_1::Stack<8UL>::~Stack((Stack<8UL> *)&value1);
  std::vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>::~vector
            ((vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_> *)
             local_70);
  std::vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::~vector
            ((vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_> *)
             &tssv.
              super__Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(void)
{
	std::vector<int, AO::Allocator::StackAllocator<int>> sv;
	std::vector<int, AO::Allocator::ThreadSafeStackAllocator<int>> tssv;
	float const classicDuration = testClassic();
	float const threadSafeDuration = testThreadSafeAllocator();
	float const unsafeDuration = testUnsafeAllocator();
	assert(unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && "Allocator is too slow");
	AO::Allocator::Stack<2 * sizeof(short) + sizeof(int)> fa;
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	int *const value1 = fa.create<int>(1);
	assert(*value1 == 1 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	short *const value2 = fa.create<short>(2);
	assert(*value2 == 2 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	short *const value3 = fa.create<short>(3);
	assert(*value3 == 3 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	int *const value4 = fa.create<int>(4);
	assert(*value4 == 4 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	fa.destroy(value4);
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should still be full (because the last element was out of stack bounds)");
	fa.destroy(value3);
	//assert(*value3 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	fa.destroy(value2);
	//assert(*value2 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	fa.destroy(value1);
	//assert(*value1 == 0 && "Object not destructed properly");
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	std::cout << "Success!" << std::endl;
	return 0;
}